

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O0

int lower_bound(uint32_t *A,uint32_t key,int imin,int imax)

{
  int iVar1;
  int iVar2;
  int imid;
  int imax_local;
  int imin_local;
  uint32_t key_local;
  uint32_t *A_local;
  int local_4;
  
  iVar1 = imax + -1;
  imin_local = imin;
  while (imax_local = iVar1, imin_local + 1 < imax_local) {
    iVar2 = imin_local + (imax_local - imin_local) / 2;
    iVar1 = iVar2;
    if ((A[iVar2] < key) && (iVar1 = imax_local, A[iVar2] < key)) {
      imin_local = iVar2;
    }
  }
  if (A[imin_local] < key) {
    local_4 = imax_local;
  }
  else {
    local_4 = imin_local;
  }
  return local_4;
}

Assistant:

static int lower_bound(uint32_t *A, uint32_t key, int imin, int imax) {
  int imid;
  imax--;
  while (imin + 1 < imax) {
    imid = imin + ((imax - imin) / 2);

    if (A[imid] >= key) {
      imax = imid;
    } else if (A[imid] < key) {
      imin = imid;
    }
  }
  if (A[imin] >= key)
    return imin;
  return imax;
}